

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O1

void dump(FILE *stream)

{
  ulong uVar1;
  pointer pAVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *pAVar6;
  int i_4;
  char *__s;
  int i_5;
  int i_1;
  int i;
  long lVar7;
  uint64_t mech;
  uint8_t value;
  uint64_t disktype;
  uint64_t p11type;
  uint64_t gen;
  allocator_type local_71;
  ulong local_70;
  vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  local_68;
  FILE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  bVar3 = readULong(stream,&local_38);
  if (!bVar3) {
    iVar4 = feof((FILE *)stream);
    if (iVar4 != 0) {
      puts("empty file");
      return;
    }
    corrupt(stream);
    return;
  }
  lVar7 = 0x38;
  do {
    printf("%02hhx ",local_38 >> ((byte)lVar7 & 0x3f) & 0xff);
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  printf("generation %lu\n",local_38);
  iVar4 = feof((FILE *)stream);
  local_50 = (FILE *)stream;
  do {
    if (iVar4 != 0) {
      return;
    }
    bVar3 = readULong(stream,&local_40);
    uVar1 = local_40;
    if (!bVar3) {
switchD_00109317_default:
      corrupt(stream);
      return;
    }
    lVar7 = 0x38;
    do {
      printf("%02hhx ",uVar1 >> ((byte)lVar7 & 0x3f) & 0xff);
      lVar7 = lVar7 + -8;
    } while (lVar7 != -8);
    if (uVar1 >> 0x20 == 0) {
      dumpCKA(uVar1,0x30);
      putchar(10);
    }
    else {
      puts("overflow attribute type");
    }
    bVar3 = readULong(stream,&local_48);
    uVar5 = local_48;
    if (!bVar3) goto switchD_00109317_default;
    lVar7 = 0x38;
    do {
      printf("%02hhx ",uVar5 >> ((byte)lVar7 & 0x3f) & 0xff);
      lVar7 = lVar7 + -8;
    } while (lVar7 != -8);
    uVar5 = uVar5 - 1;
    __s = "unknown attribute format";
    if (uVar5 < 5) {
      __s = &DAT_0010b05c + *(int *)(&DAT_0010b05c + uVar5 * 4);
    }
    puts(__s);
    switch(uVar5) {
    case 0:
      bVar3 = readBool(stream,(uint8_t *)&local_68);
      if (!bVar3) {
        corrupt(stream);
        return;
      }
      dumpBool((uint8_t)local_68.
                        super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,false);
      putchar(10);
      goto LAB_00109625;
    case 1:
      bVar3 = readULong(stream,(uint64_t *)&local_68);
      pAVar2 = local_68.
               super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
        lVar7 = 0x38;
        do {
          printf("%02hhx ",(ulong)pAVar2 >> ((byte)lVar7 & 0x3f) & 0xff);
          lVar7 = lVar7 + -8;
        } while (lVar7 != -8);
        dumpCKx(uVar1,(uint64_t)pAVar2,0x30);
        putchar(10);
        stream = (FILE *)local_50;
      }
      else {
        corrupt(stream);
      }
      break;
    case 2:
      bVar3 = readULong(stream,&local_70);
      uVar1 = local_70;
      if (!bVar3) goto switchD_00109317_default;
      lVar7 = 0x38;
      do {
        printf("%02hhx ",uVar1 >> ((byte)lVar7 & 0x3f) & 0xff);
        lVar7 = lVar7 + -8;
      } while (lVar7 != -8);
      if (0x3fffffff < uVar1) {
LAB_0010965d:
        puts("overflow length...");
        return;
      }
      printf("(length %lu)\n",uVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,uVar1,&local_71)
      ;
      bVar3 = readBytes(stream,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      if (bVar3) {
        dumpBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,false);
      }
      else {
        corrupt(stream);
      }
      if (local_68.
          super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0) {
        operator_delete(local_68.
                        super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      break;
    case 3:
      bVar3 = readULong(stream,&local_70);
      uVar1 = local_70;
      if (!bVar3) goto switchD_00109317_default;
      lVar7 = 0x38;
      do {
        printf("%02hhx ",uVar1 >> ((byte)lVar7 & 0x3f) & 0xff);
        lVar7 = lVar7 + -8;
      } while (lVar7 != -8);
      if (0x3fffffff < uVar1) goto LAB_0010965d;
      printf("(length %lu)\n",uVar1);
      local_68.
      super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
      local_68.
      super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
      local_68.
      super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = readMap(stream,uVar1,&local_68);
      pAVar6 = local_68.
               super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
        for (; pAVar6 != local_68.
                         super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; pAVar6 = pAVar6 + 1) {
          AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>::dump(pAVar6);
        }
      }
      else {
        corrupt(stream);
      }
      std::
      vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::~vector(&local_68);
      break;
    case 4:
      bVar3 = readULong(stream,(uint64_t *)&local_68);
      pAVar2 = local_68.
               super__Vector_base<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar3) goto switchD_00109317_default;
      lVar7 = 0x38;
      do {
        printf("%02hhx ",(ulong)pAVar2 >> ((byte)lVar7 & 0x3f) & 0xff);
        lVar7 = lVar7 + -8;
      } while (lVar7 != -8);
      if ((AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x3fffffff < pAVar2)
      goto LAB_0010965d;
      printf("(length %lu)\n",pAVar2);
      if (pAVar2 != (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0) {
        pAVar6 = (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)0x0;
        do {
          bVar3 = readULong(stream,&local_70);
          uVar1 = local_70;
          if (bVar3) {
            lVar7 = 0x38;
            do {
              printf("%02hhx ",uVar1 >> ((byte)lVar7 & 0x3f) & 0xff);
              lVar7 = lVar7 + -8;
            } while (lVar7 != -8);
            dumpCKM(uVar1,0x30);
            putchar(10);
            stream = (FILE *)local_50;
          }
          else {
            corrupt(stream);
          }
          if (!bVar3) {
            return;
          }
          pAVar6 = (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *)
                   ((long)&pAVar6->type + 1);
        } while (pAVar6 != pAVar2);
      }
      goto LAB_00109625;
    default:
      goto switchD_00109317_default;
    }
    if (bVar3 == false) {
      return;
    }
LAB_00109625:
    iVar4 = feof((FILE *)stream);
  } while( true );
}

Assistant:

void dump(FILE* stream)
{
	uint64_t gen;
	if (!readULong(stream, gen))
	{
		if (feof(stream))
		{
			printf("empty file\n");
		}
		else
		{
			corrupt(stream);
		}
		return;
	}
	dumpULong(gen);
	printf("generation %lu\n", (unsigned long) gen);

	while (!feof(stream))
	{
		uint64_t p11type;
		if (!readULong(stream, p11type))
		{
			corrupt(stream);
			return;
		}
		dumpULong(p11type);
		if ((uint64_t)((uint32_t)p11type) != p11type)
		{
			printf("overflow attribute type\n");
		}
		else
		{
			dumpCKA((unsigned long) p11type, 48);
			printf("\n");
		}

		uint64_t disktype;
		if (!readULong(stream, disktype))
		{
			corrupt(stream);
			return;
		}
		dumpULong(disktype);
		switch (disktype)
		{
		case BOOLEAN_ATTR:
			printf("boolean attribute\n");
			break;
		case ULONG_ATTR:
			printf("unsigned long attribute\n");
			break;
		case BYTES_ATTR:
			printf("byte string attribute\n");
			break;
		case ATTRMAP_ATTR:
			printf("attribute map attribute\n");
			break;
		case MECHSET_ATTR:
			printf("mechanism set attribute\n");
			break;
		default:
			printf("unknown attribute format\n");
			break;
		}

		if (disktype == BOOLEAN_ATTR)
		{
			uint8_t value;
			if (!readBool(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBool(value);
			printf("\n");
		}
		else if (disktype == ULONG_ATTR)
		{
			uint64_t value;
			if (!readULong(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpULong(value);
			dumpCKx(p11type, value, 48);
			printf("\n");
		}
		else if (disktype == BYTES_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<uint8_t> value((size_t) len);
			if (!readBytes(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBytes(value);
		}
		else if (disktype == ATTRMAP_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<Attribute> value;
			if (!readMap(stream, len, value))
			{
				corrupt(stream);
				return;
			}
			dumpMap(value);
		}
		else if (disktype == MECHSET_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			for (unsigned long i = 0; i < len; i++)
			{
				uint64_t mech;
				if (!readULong(stream, mech))
				{
					corrupt(stream);
					return;
				}
				dumpULong(mech);
				dumpCKM(mech, 48);
				printf("\n");
			}
		}
		else
		{
			corrupt(stream);
			return;
		}
	}
}